

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescale_freqs.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  type_conflict2 tVar2;
  any *operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  string *file_name_00;
  directory_iterator i;
  directory_iterator end_itr;
  regex input_file_filter;
  smatch what;
  vector<unsigned_int,_std::allocator<unsigned_int>_> input_u32s;
  path p;
  string file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_dir;
  string short_name;
  variables_map cmdargs;
  directory_iterator local_268;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_260;
  shared_ptr<boost::re_detail_107400::basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
  local_258;
  undefined1 local_248 [32];
  undefined1 uStack_228;
  undefined8 uStack_227;
  undefined8 uStack_21f;
  shared_ptr<boost::re_detail_107400::named_subexpressions> local_210;
  int local_200;
  bool local_1fc;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  path local_1d8;
  int local_1b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190 [32];
  key_type local_170;
  string local_150;
  string local_130 [32];
  string local_110;
  string local_f0;
  string local_d0 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [144];
  
  parse_cmdargs((int)local_d0,(char **)(ulong)(uint)argc);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,"input",(allocator<char> *)&local_1d8);
  operand = (any *)boost::program_options::abstract_variables_map::operator[](local_d0);
  pbVar3 = boost::any_cast<std::__cxx11::string_const&>(operand);
  std::__cxx11::string::string(local_190,(string *)pbVar3);
  std::__cxx11::string::~string((string *)local_248);
  boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::basic_regex
            ((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
             &local_258,".*\\.u32",0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,"text",(allocator<char> *)&local_1d8);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_c0,(key_type *)local_248);
  std::__cxx11::string::~string((string *)local_248);
  if (sVar4 != 0) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
                local_248,".*\\.txt",0);
    boost::
    shared_ptr<boost::re_detail_107400::basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
    ::operator=(&local_258,
                (shared_ptr<boost::re_detail_107400::basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
                 *)local_248);
    boost::detail::shared_count::~shared_count((shared_count *)(local_248 + 8));
  }
  std::__cxx11::string::string((string *)&local_1d8,local_190);
  bVar1 = boost::filesystem::is_regular_file(&local_1d8);
  if (bVar1) {
    boost::filesystem::path::filename();
    boost::basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>> *)
               &local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,0);
    boost::
    shared_ptr<boost::re_detail_107400::basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
    ::operator=(&local_258,
                (shared_ptr<boost::re_detail_107400::basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>_>
                 *)&local_1b0);
    boost::detail::shared_count::~shared_count((shared_count *)&local_1b0._M_string_length);
    std::__cxx11::string::~string((string *)local_248);
    boost::filesystem::path::parent_path();
    std::__cxx11::string::_M_assign(local_190);
    std::__cxx11::string::~string((string *)local_248);
  }
  local_260.px = (dir_itr_imp *)0x0;
  std::__cxx11::string::string((string *)local_248,local_190);
  boost::filesystem::directory_iterator::directory_iterator(&local_268,(path *)local_248,none);
  std::__cxx11::string::~string((string *)local_248);
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)&local_268,
                       (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)&local_260);
    if (!tVar2) break;
    boost::filesystem::directory_entry::status((directory_entry *)local_1b8);
    if (local_1b8[0] == 2) {
      uStack_228 = 0;
      uStack_227 = 0;
      uStack_21f = 0;
      local_248._0_8_ = (pointer)0x0;
      local_248._8_8_ = (sp_counted_base *)0x0;
      local_248[0x10] = '\0';
      local_248._17_7_ = 0;
      local_248[0x18] = '\0';
      local_248._25_7_ = 0;
      local_200 = 0;
      local_210 = (shared_ptr<boost::re_detail_107400::named_subexpressions>)(ZEXT416(0) << 0x40);
      local_1fc = true;
      boost::filesystem::path::filename();
      bVar1 = boost::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                        (&local_1b0,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_248,
                         (basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                          *)&local_258,format_default);
      std::__cxx11::string::~string((string *)&local_1b0);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_1b0,(string *)((long)local_268.m_imp.px + 8));
        local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"text",(allocator<char> *)local_130);
        sVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(local_c0,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        if (sVar4 == 0) {
          file_name_00 = &local_110;
          std::__cxx11::string::string((string *)file_name_00,(string *)&local_1b0);
          read_file_u32((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_170,
                        file_name_00);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8,&local_170);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_170);
        }
        else {
          file_name_00 = &local_f0;
          std::__cxx11::string::string((string *)file_name_00,(string *)&local_1b0);
          read_file_text((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_170,
                         file_name_00);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8,&local_170);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_170);
        }
        std::__cxx11::string::~string((string *)file_name_00);
        boost::filesystem::path::stem();
        std::__cxx11::string::string((string *)&local_170,local_130);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::string((string *)&local_150,(string *)&local_170);
        rescale_freqs((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1f8,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1f8);
        std::__cxx11::string::~string((string *)&local_1b0);
      }
      boost::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_248);
    }
    boost::filesystem::directory_iterator::increment(&local_268);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_268.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_260);
  std::__cxx11::string::~string((string *)&local_1d8);
  boost::detail::shared_count::~shared_count(&local_258.pn);
  std::__cxx11::string::~string(local_190);
  boost::program_options::variables_map::~variables_map((variables_map *)local_d0);
  return 0;
}

Assistant:

int main(int argc, char const* argv[])
{
    auto cmdargs = parse_cmdargs(argc, argv);
    auto input_dir = cmdargs["input"].as<std::string>();

    boost::regex input_file_filter(".*\\.u32");
    if (cmdargs.count("text")) {
        input_file_filter = boost::regex(".*\\.txt");
    }

    // single file also works!
    boost::filesystem::path p(input_dir);
    if (boost::filesystem::is_regular_file(p)) {
        input_file_filter = boost::regex(p.filename().string());
        input_dir = p.parent_path().string();
    }

    boost::filesystem::directory_iterator
        end_itr; // Default ctor yields past-the-end
    for (boost::filesystem::directory_iterator i(input_dir); i != end_itr;
         ++i) {
        if (!boost::filesystem::is_regular_file(i->status()))
            continue;
        boost::smatch what;
        if (!boost::regex_match(
                i->path().filename().string(), what, input_file_filter))
            continue;

        std::string file_name = i->path().string();
        std::vector<uint32_t> input_u32s;
        if (cmdargs.count("text")) {
            input_u32s = read_file_text(file_name);
        } else {
            input_u32s = read_file_u32(file_name);
        }
        std::string short_name = i->path().stem().string();

        rescale_freqs(input_u32s, short_name);
    }

    return EXIT_SUCCESS;
}